

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O2

void __thiscall bandit::reporter::xunit::it_skip(xunit *this,string *desc)

{
  int *piVar1;
  undefined1 *puVar2;
  ostream *poVar3;
  string sStack_68;
  string local_48;
  
  piVar1 = &(this->super_progress_base).specs_skipped_;
  *piVar1 = *piVar1 + 1;
  puVar2 = &this->field_0x80;
  poVar3 = std::operator<<((ostream *)puVar2,"\t<testcase classname=\"");
  progress_base::current_context_name_abi_cxx11_(&local_48,&this->super_progress_base);
  escape(&sStack_68,this,&local_48);
  poVar3 = std::operator<<(poVar3,(string *)&sStack_68);
  std::operator<<(poVar3,"\" ");
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  poVar3 = std::operator<<((ostream *)puVar2,"name=\"");
  escape(&sStack_68,this,desc);
  poVar3 = std::operator<<(poVar3,(string *)&sStack_68);
  std::operator<<(poVar3,"\" time=\"0.0\">\n");
  std::__cxx11::string::~string((string *)&sStack_68);
  std::operator<<((ostream *)puVar2,"\t\t<skipped />\n");
  std::operator<<((ostream *)puVar2,"\t</testcase>\n");
  return;
}

Assistant:

void it_skip(const std::string& desc) override {
        progress_base::it_skip(desc);
        work_stm_ << "\t<testcase classname=\"" << escape(current_context_name()) << "\" ";
        work_stm_ << "name=\"" << escape(desc) << "\" time=\"0.0\">\n";
        work_stm_ << "\t\t<skipped />\n";
        work_stm_ << "\t</testcase>\n";
      }